

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_callback_all_protocol_vhost_args
              (lws_vhost *vh,lws_protocols *protocol,int reason,void *argp,size_t len)

{
  lws_context *context;
  lws *plVar1;
  lws_context_per_thread *plVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  context = vh->context;
  plVar2 = context->pt;
  iVar4 = (int)context->count_threads;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    for (uVar3 = 0; uVar3 < plVar2->fds_count; uVar3 = uVar3 + 1) {
      plVar1 = wsi_from_fd(context,plVar2->fds[uVar3].fd);
      if (((plVar1 != (lws *)0x0) && (plVar1->vhost == vh)) &&
         ((protocol == (lws_protocols *)0x0 || (plVar1->protocol == protocol)))) {
        (*plVar1->protocol->callback)(plVar1,reason,plVar1->user_space,argp,len);
      }
    }
    plVar2 = plVar2 + 1;
  }
  return 0;
}

Assistant:

int
lws_callback_all_protocol_vhost_args(struct lws_vhost *vh,
			  const struct lws_protocols *protocol, int reason,
			  void *argp, size_t len)
{
	struct lws_context *context = vh->context;
	struct lws_context_per_thread *pt = &context->pt[0];
	unsigned int n, m = context->count_threads;
	struct lws *wsi;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->vhost == vh && (wsi->protocol == protocol ||
						 !protocol))
				wsi->protocol->callback(wsi, reason,
						wsi->user_space, argp, len);
		}
		pt++;
	}

	return 0;
}